

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::AddSchnorrSign
          (TransactionContext *this,OutPoint *outpoint,SchnorrSignature *signature,ByteData *annex)

{
  initializer_list<cfd::SignParameter> __l;
  allocator_type local_c9;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  SignParameter local_98;
  
  core::SchnorrSignature::GetData((ByteData *)&local_b0,signature,true);
  SignParameter::SignParameter(&local_98,(ByteData *)&local_b0);
  __l._M_len = 1;
  __l._M_array = &local_98;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&sign_params,__l,&local_c9);
  SignParameter::~SignParameter(&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
  if (annex != (ByteData *)0x0) {
    std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
    emplace_back<cfd::core::ByteData_const&>
              ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&sign_params,annex);
  }
  TransactionContextUtil::AddSign<cfd::TransactionContext>(this,outpoint,&sign_params,true,true);
  core::SchnorrSignature::GetSigHashType((SchnorrSignature *)&local_98);
  std::
  _Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>>
  ::_M_emplace_unique<cfd::core::OutPoint_const&,cfd::core::SigHashType>
            ((_Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::SigHashType>>>
              *)&this->signed_map_,outpoint,(SigHashType *)&local_98);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&sign_params);
  return;
}

Assistant:

void TransactionContext::AddSchnorrSign(
    const OutPoint& outpoint, const SchnorrSignature& signature,
    const ByteData* annex) {
  std::vector<SignParameter> sign_params = {
      SignParameter(signature.GetData(true))};
  if (annex != nullptr) sign_params.emplace_back(*annex);
  AddSign(outpoint, sign_params, true, true);
  signed_map_.emplace(outpoint, signature.GetSigHashType());
}